

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pointer.cpp
# Opt level: O0

int use_new(void)

{
  int *piVar1;
  ostream *poVar2;
  void *pvVar3;
  double *pdVar4;
  double *p3;
  double *pd;
  int *pt;
  int nights;
  
  pt._4_4_ = 0x3e9;
  piVar1 = (int *)operator_new(4);
  *piVar1 = 0x3e9;
  poVar2 = std::operator<<((ostream *)&std::cout,"nights = ");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,pt._4_4_);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  poVar2 = (ostream *)std::ostream::operator<<(&std::cout,pt._4_4_);
  poVar2 = std::operator<<(poVar2,"location = ");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,(void *)((long)&pt + 4));
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"int value = ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*piVar1);
  poVar2 = std::operator<<(poVar2,"; location = ");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,piVar1);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  pdVar4 = (double *)operator_new(8);
  *pdVar4 = 10011002.0;
  poVar2 = std::operator<<((ostream *)&std::cout,"double value = ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*pdVar4);
  poVar2 = std::operator<<(poVar2,"; location = ");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,pdVar4);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"size of pt = ");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,8);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"size of *pt = ");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,4);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"size of pd = ");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,8);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"size of *pd = ");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,8);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  if (pdVar4 != (double *)0x0) {
    operator_delete(pdVar4);
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"after delete, *pd = ");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,*pdVar4);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  pdVar4 = (double *)operator_new__(0x18);
  *pdVar4 = 0.1;
  pdVar4[1] = 0.2;
  pdVar4[2] = 0.3;
  poVar2 = std::operator<<((ostream *)&std::cout,"p3[1] is ");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,pdVar4[1]);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"now p3[1] is ");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,pdVar4[2]);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  if (pdVar4 != (double *)0x0) {
    operator_delete__(pdVar4);
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"after delete, p3[1]");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,*pdVar4);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  return 0;
}

Assistant:

int use_new () {
    using namespace std;
    int nights= 1001;
    //  申请一个 int 类型的地址
    int * pt = new int;
    //  给这个地址处赋值1001
    *pt = 1001;

    cout << "nights = " << nights << endl;
    cout << nights << "location = " << & nights << endl;

    cout << "int value = " << *pt << "; location = " << pt << endl;

    double * pd = new double;
    *pd = 10011002.0;
    cout << "double value = " << *pd << "; location = " << pd << endl;

    cout << "size of pt = " << sizeof(pt) << endl;
    cout << "size of *pt = " << sizeof(*pt) << endl;

    cout << "size of pd = " << sizeof(pd) << endl;
    cout << "size of *pd = " << sizeof(*pd) << endl;

    // sizeof a address: 4 byte = 32bit

    delete pd;
    cout << "after delete, *pd = " << *pd << endl;

    // array with new

    double *p3 = new double[3];
    //  用起来和普通ARRAY没什么区别...
    p3[0] = 0.1;
    p3[1] = 0.2;
    p3[2] = 0.3;

    cout << "p3[1] is " << p3[1] << endl;
    p3 = p3 + 1;
    cout << "now p3[1] is " << p3[1] << endl;

    p3 = p3 - 1;
    delete [] p3;
    cout << "after delete, p3[1]" << p3[0] << endl;

    return 0;
}